

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

bool __thiscall testing::internal::DeathTestImpl::Passed(DeathTestImpl *this,bool status_ok)

{
  ostream *poVar1;
  ostream *poVar2;
  uint uVar3;
  _Alloc_hider ss;
  int iVar4;
  size_t sVar5;
  CapturedStream **in_RDX;
  uint uVar6;
  undefined8 ss_00;
  char *pcVar7;
  bool bVar8;
  string local_98;
  undefined1 local_78 [8];
  string error_message;
  regmatch_t local_50;
  regmatch_t match;
  
  if (this->spawned_ != true) {
    return false;
  }
  GetCapturedStream_abi_cxx11_((string *)local_78,(internal *)&g_captured_stderr,in_RDX);
  Message::Message((Message *)((long)&error_message.field_2 + 8));
  ss_00 = error_message.field_2._8_8_;
  poVar1 = (ostream *)(error_message.field_2._8_8_ + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Death test: ",0xc);
  pcVar7 = this->statement_;
  if (pcVar7 == (char *)0x0) {
    sVar5 = 6;
    pcVar7 = "(null)";
  }
  else {
    sVar5 = strlen(pcVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar7,sVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  switch(this->outcome_) {
  case DIED:
    if (status_ok) {
      if ((this->regex_[8] == (RE)0x1) &&
         (iVar4 = regexec((regex_t *)(this->regex_ + 0x50),(char *)local_78,1,
                          &stack0xffffffffffffffb0,0), iVar4 == 0)) {
        bVar8 = true;
        goto LAB_001528e2;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"    Result: died but not with expected error.\n",0x2e);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  Expected: ",0xc);
      pcVar7 = *(char **)this->regex_;
      if (pcVar7 == (char *)0x0) {
        sVar5 = 6;
        pcVar7 = "(null)";
      }
      else {
        sVar5 = strlen(pcVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar7,sVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Actual msg:\n",0xc);
      FormatDeathTestOutput((string *)&stack0xffffffffffffffb0,(string *)local_78);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_50,(long)match);
      break;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"    Result: died but not with expected exit code:\n",0x32);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"            ",0xc);
    uVar3 = this->status_;
    Message::Message((Message *)&local_98);
    ss._M_p = local_98._M_dataplus._M_p;
    uVar6 = uVar3 & 0x7f;
    if (uVar6 == 0) {
      poVar2 = (ostream *)(local_98._M_dataplus._M_p + 0x10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Exited with exit status ",0x18);
      std::ostream::operator<<((ostream *)poVar2,uVar3 >> 8 & 0xff);
    }
    else if (0x1ffffff < (int)(uVar6 * 0x1000000 + 0x1000000)) {
      poVar2 = (ostream *)(local_98._M_dataplus._M_p + 0x10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Terminated by signal ",0x15);
      std::ostream::operator<<((ostream *)poVar2,uVar6);
    }
    if ((char)uVar3 < '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(ss._M_p + 0x10)," (core dumped)",0xe);
    }
    StringStreamToString((string *)&stack0xffffffffffffffb0,(stringstream *)ss._M_p);
    if ((stringstream *)ss._M_p != (stringstream *)0x0) {
      (**(code **)(*(long *)ss._M_p + 8))(ss._M_p);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_50,(long)match);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Actual msg:\n",0xc);
    FormatDeathTestOutput(&local_98,(string *)local_78);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,local_98._M_dataplus._M_p,local_98._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if (local_50 != (regmatch_t)&stack0xffffffffffffffc0) {
      operator_delete((void *)local_50);
    }
    goto LAB_001528df;
  case LIVED:
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"    Result: failed to die.\n",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," Error msg:\n",0xc);
    FormatDeathTestOutput((string *)&stack0xffffffffffffffb0,(string *)local_78);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_50,(long)match);
    break;
  case RETURNED:
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"    Result: illegal return in test statement.\n",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," Error msg:\n",0xc);
    FormatDeathTestOutput((string *)&stack0xffffffffffffffb0,(string *)local_78);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_50,(long)match);
    break;
  case THREW:
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"    Result: threw an exception.\n",0x20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," Error msg:\n",0xc);
    FormatDeathTestOutput((string *)&stack0xffffffffffffffb0,(string *)local_78);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_50,(long)match);
    break;
  default:
    GTestLog::GTestLog((GTestLog *)&stack0xffffffffffffffb0,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/external/googletest/src/gtest-death-test.cc"
                       ,0x23b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DeathTest::Passed somehow called before conclusion of test",
               0x3a);
    GTestLog::~GTestLog((GTestLog *)&stack0xffffffffffffffb0);
    error_message.field_2._8_8_ = ss_00;
    goto LAB_001528df;
  }
  error_message.field_2._8_8_ = ss_00;
  if (local_50 != (regmatch_t)&stack0xffffffffffffffc0) {
    operator_delete((void *)local_50);
  }
LAB_001528df:
  bVar8 = false;
  ss_00 = error_message.field_2._8_8_;
LAB_001528e2:
  StringStreamToString((string *)&stack0xffffffffffffffb0,(stringstream *)ss_00);
  std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
  if (local_50 != (regmatch_t)&stack0xffffffffffffffc0) {
    operator_delete((void *)local_50);
  }
  if ((stringstream *)ss_00 != (stringstream *)0x0) {
    (**(code **)(*(long *)ss_00 + 8))(ss_00);
  }
  if (local_78 != (undefined1  [8])&error_message._M_string_length) {
    operator_delete((void *)local_78);
  }
  return bVar8;
}

Assistant:

bool DeathTestImpl::Passed(bool status_ok) {
  if (!spawned())
    return false;

  const std::string error_message = GetCapturedStderr();

  bool success = false;
  Message buffer;

  buffer << "Death test: " << statement() << "\n";
  switch (outcome()) {
    case LIVED:
      buffer << "    Result: failed to die.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case THREW:
      buffer << "    Result: threw an exception.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case RETURNED:
      buffer << "    Result: illegal return in test statement.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case DIED:
      if (status_ok) {
        const bool matched = RE::PartialMatch(error_message.c_str(), *regex());
        if (matched) {
          success = true;
        } else {
          buffer << "    Result: died but not with expected error.\n"
                 << "  Expected: " << regex()->pattern() << "\n"
                 << "Actual msg:\n" << FormatDeathTestOutput(error_message);
        }
      } else {
        buffer << "    Result: died but not with expected exit code:\n"
               << "            " << ExitSummary(status()) << "\n"
               << "Actual msg:\n" << FormatDeathTestOutput(error_message);
      }
      break;
    case IN_PROGRESS:
    default:
      GTEST_LOG_(FATAL)
          << "DeathTest::Passed somehow called before conclusion of test";
  }

  DeathTest::set_last_death_test_message(buffer.GetString());
  return success;
}